

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_template_checker.cpp
# Opt level: O0

void __thiscall
validation_layer::validationCheckerTemplate::validationCheckerTemplate
          (validationCheckerTemplate *this)

{
  bool bVar1;
  ZESvalidationCheckerTemplate *pZVar2;
  ZETvalidationCheckerTemplate *this_00;
  context_t *pcVar3;
  value_type local_30;
  ZETvalidationCheckerTemplate *local_28;
  ZETvalidationCheckerTemplate *zetChecker;
  ZESvalidationCheckerTemplate *zesChecker;
  ZEvalidationCheckerTemplate *zeChecker;
  validationCheckerTemplate *this_local;
  
  this->enableValidationCheckerTemplate = false;
  zeChecker = (ZEvalidationCheckerTemplate *)this;
  bVar1 = getenv_tobool("ZEL_ENABLE_VALIDATION_CHECKER_TEMPLATE");
  this->enableValidationCheckerTemplate = bVar1;
  if ((this->enableValidationCheckerTemplate & 1U) != 0) {
    pZVar2 = (ZESvalidationCheckerTemplate *)operator_new(8);
    ZEvalidationCheckerTemplate::ZEvalidationCheckerTemplate((ZEvalidationCheckerTemplate *)pZVar2);
    zesChecker = pZVar2;
    pZVar2 = (ZESvalidationCheckerTemplate *)operator_new(8);
    ZESvalidationCheckerTemplate::ZESvalidationCheckerTemplate(pZVar2);
    zetChecker = (ZETvalidationCheckerTemplate *)pZVar2;
    this_00 = (ZETvalidationCheckerTemplate *)operator_new(8);
    ZETvalidationCheckerTemplate::ZETvalidationCheckerTemplate(this_00);
    templateChecker = zesChecker;
    DAT_00322f98 = zetChecker;
    DAT_00322fa0 = this_00;
    local_28 = this_00;
    pcVar3 = context_t::getInstance();
    local_30 = (value_type)&templateChecker;
    std::
    vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
    ::push_back(&pcVar3->validationHandlers,&local_30);
  }
  return;
}

Assistant:

validationCheckerTemplate::validationCheckerTemplate() {
        enableValidationCheckerTemplate = getenv_tobool( "ZEL_ENABLE_VALIDATION_CHECKER_TEMPLATE" );
        if(enableValidationCheckerTemplate) {
            validationCheckerTemplate::ZEvalidationCheckerTemplate *zeChecker = new validationCheckerTemplate::ZEvalidationCheckerTemplate;
            validationCheckerTemplate::ZESvalidationCheckerTemplate *zesChecker = new validationCheckerTemplate::ZESvalidationCheckerTemplate;
            validationCheckerTemplate::ZETvalidationCheckerTemplate *zetChecker = new validationCheckerTemplate::ZETvalidationCheckerTemplate;
            templateChecker.zeValidation = zeChecker;
            templateChecker.zetValidation = zetChecker;
            templateChecker.zesValidation = zesChecker;
            validation_layer::context.getInstance().validationHandlers.push_back(&templateChecker);
        }
    }